

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_config_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_65e8d::Av1Config_GetAv1ConfigFromAnnexBObu_Test::TestBody
          (Av1Config_GetAv1ConfigFromAnnexBObu_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  bool in_stack_000001d7;
  size_t in_stack_000001d8;
  uint8_t *in_stack_000001e0;
  bool *in_stack_ffffffffffffff48;
  AssertionResult *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff6c;
  char *in_stack_ffffffffffffff70;
  Type in_stack_ffffffffffffff7c;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  AssertionResult local_78;
  uint local_64;
  string local_60 [16];
  char *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  AssertionResult *in_stack_ffffffffffffffc8;
  AssertHelper *in_stack_ffffffffffffffd0;
  AssertionResult local_18;
  
  VerifyAv1c(in_stack_000001e0,in_stack_000001d8,in_stack_000001d7);
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(type *)0x3b4db7);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               in_stack_ffffffffffffffb0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
               in_stack_ffffffffffffff60);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffffd0,(Message *)in_stack_ffffffffffffffc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff50);
    std::__cxx11::string::~string(local_60);
    testing::Message::~Message((Message *)0x3b4e66);
  }
  local_64 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b4f04);
  if (local_64 == 0) {
    uVar2 = VerifyAv1c(in_stack_000001e0,in_stack_000001d8,in_stack_000001d7);
    testing::AssertionResult::AssertionResult<bool>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(type *)0x3b4f42);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_78);
    if (!bVar1) {
      testing::Message::Message((Message *)CONCAT17(uVar2,in_stack_ffffffffffffff80));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                 in_stack_ffffffffffffffb0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(uVar2,in_stack_ffffffffffffff80),in_stack_ffffffffffffff7c
                 ,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffffd0,(Message *)in_stack_ffffffffffffffc8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff50);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
      testing::Message::~Message((Message *)0x3b4ff4);
    }
    local_64 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b5086);
  }
  return;
}

Assistant:

TEST(Av1Config, GetAv1ConfigFromAnnexBObu) {
  // Test parsing of a Sequence Header OBU with the reduced_still_picture_header
  // unset-- aka a full Sequence Header OBU.
  ASSERT_TRUE(VerifyAv1c(kAnnexBFullSequenceHeaderObu,
                         sizeof(kAnnexBFullSequenceHeaderObu), true));

  // Test parsing of a reduced still image Sequence Header OBU.
  ASSERT_TRUE(VerifyAv1c(kAnnexBReducedStillImageSequenceHeaderObu,
                         sizeof(kAnnexBReducedStillImageSequenceHeaderObu),
                         true));
}